

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O2

bool __thiscall
aeron::archive::ArchiveProxy::truncateRecording
          (ArchiveProxy *this,int64_t recordingId,int64_t position,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  TruncateRecordingRequest *pTVar2;
  int64_t val;
  int64_t val_2;
  int64_t val_1;
  int64_t val_3;
  TruncateRecordingRequest msg;
  TruncateRecordingRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  pTVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::TruncateRecordingRequest>(this,&local_68);
  *(int64_t *)(pTVar2->m_buffer + pTVar2->m_offset) = controlSessionId;
  *(int64_t *)(pTVar2->m_buffer + pTVar2->m_offset + 8) = correlationId;
  *(int64_t *)(pTVar2->m_buffer + pTVar2->m_offset + 0x10) = recordingId;
  *(int64_t *)(pTVar2->m_buffer + pTVar2->m_offset + 0x18) = position;
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::truncateRecording(std::int64_t recordingId, std::int64_t position, std::int64_t correlationId,
                                     std::int64_t controlSessionId) {
    codecs::TruncateRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId)
        .position(position);

    return offer(msg.encodedLength());
}